

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_common.h
# Opt level: O2

void __thiscall
ktx::OptionsEncodeCommon::process
          (OptionsEncodeCommon *this,Options *param_1,ParseResult *args,Reporter *param_3)

{
  size_t sVar1;
  uint uVar2;
  OptionValue *pOVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,kNormalMode,&local_39);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_38);
  if (sVar1 != 0) {
    captureCommonOption(this,kNormalMode);
    this->normalMap = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,kThreads,&local_39);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_38);
  if (sVar1 != 0) {
    uVar2 = captureCodecOption<unsigned_int>(this,args,kThreads);
    this->threadCount = uVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,kNoSse,&local_39);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_38);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_38);
  if (sVar1 != 0) {
    captureCommonOption(this,kNoSse);
    this->noSSE = true;
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter&) {
        if (args[kNormalMode].count()) {
            captureCommonOption(kNormalMode);
            normalMap = true;
        }

        if (args[kThreads].count()) {
            threadCount = captureCodecOption<uint32_t>(args, kThreads);
        }

        if (args[kNoSse].count()) {
            captureCommonOption(kNoSse);
            noSSE = true;
        }
    }